

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  float *pfVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  stbi_uc *psVar9;
  ulong uVar10;
  double dVar11;
  
  uVar3 = x * y;
  pfVar1 = (float *)malloc((long)(int)(uVar3 * comp) << 2);
  if (pfVar1 == (float *)0x0) {
    free(data);
    failure_reason = "Out of memory";
  }
  else {
    uVar8 = (comp + (comp & 1U)) - 1;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    lVar2 = (long)comp;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    pfVar7 = pfVar1;
    psVar9 = data;
    for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        dVar11 = pow((double)((float)psVar9[uVar10] / 255.0),(double)l2h_gamma);
        pfVar7[uVar10] = (float)dVar11 * l2h_scale;
      }
      if ((int)uVar8 < comp) {
        lVar5 = uVar6 * lVar2 + (ulong)uVar8;
        pfVar1[lVar5] = (float)data[lVar5] / 255.0;
      }
      psVar9 = psVar9 + lVar2;
      pfVar7 = pfVar7 + lVar2;
    }
    free(data);
  }
  return pfVar1;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}